

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O1

void __thiscall leveldb::VersionSet::Builder::Builder(Builder *this,VersionSet *vset,Version *base)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  
  this->vset_ = vset;
  this->base_ = base;
  lVar3 = 0;
  do {
    lVar1 = (long)&this->levels_[0].deleted_files._M_t._M_impl.super__Rb_tree_header._M_header.
                   _M_color + lVar3;
    *(undefined4 *)
     ((long)&this->levels_[0].deleted_files._M_t._M_impl.super__Rb_tree_header._M_header._M_color +
     lVar3) = 0;
    *(undefined8 *)
     ((long)&this->levels_[0].deleted_files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent +
     lVar3) = 0;
    *(long *)((long)&this->levels_[0].deleted_files._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_left + lVar3) = lVar1;
    *(long *)((long)&this->levels_[0].deleted_files._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_right + lVar3) = lVar1;
    *(undefined8 *)
     ((long)&this->levels_[0].deleted_files._M_t._M_impl.super__Rb_tree_header._M_node_count + lVar3
     ) = 0;
    lVar3 = lVar3 + 0x38;
  } while (lVar3 != 0x188);
  base->refs_ = base->refs_ + 1;
  lVar3 = 0x40;
  do {
    plVar2 = (long *)operator_new(0x30);
    *plVar2 = (long)&vset->icmp_;
    *(undefined4 *)(plVar2 + 1) = 0;
    plVar2[2] = 0;
    plVar2[3] = (long)(plVar2 + 1);
    plVar2[4] = (long)(plVar2 + 1);
    plVar2[5] = 0;
    *(long **)((long)this->levels_ + lVar3 + -0x10) = plVar2;
    lVar3 = lVar3 + 0x38;
  } while (lVar3 != 0x1c8);
  return;
}

Assistant:

Builder(VersionSet* vset, Version* base) : vset_(vset), base_(base) {
    base_->Ref();
    BySmallestKey cmp;
    cmp.internal_comparator = &vset_->icmp_;
    for (int level = 0; level < config::kNumLevels; level++) {
      levels_[level].added_files = new FileSet(cmp);
    }
  }